

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O1

bool double_conversion::(anonymous_namespace)::ConsumeSubString<char_const*>
               (char **current,char *end,char *substring,bool allow_case_insensitivity)

{
  char cVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  locale *plVar5;
  char *pcVar6;
  undefined7 in_register_00000009;
  bool bVar7;
  
  if ((int)CONCAT71(in_register_00000009,allow_case_insensitivity) == 0) {
    pcVar6 = *current;
    pcVar4 = substring + 1;
    do {
      pcVar6 = pcVar6 + 1;
      bVar7 = *pcVar4 == '\0';
      *current = pcVar6;
      if (bVar7) {
        return bVar7;
      }
      if (pcVar6 == end) {
        return bVar7;
      }
      cVar1 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (*pcVar6 == cVar1);
  }
  else {
    pcVar6 = substring + 1;
    do {
      pcVar4 = *current + 1;
      bVar7 = *pcVar6 == '\0';
      *current = pcVar4;
      if (bVar7) {
        return bVar7;
      }
      if (pcVar4 == end) {
        return bVar7;
      }
      cVar1 = *pcVar4;
      if ((ToLower(char)::cType == '\0') &&
         (iVar3 = __cxa_guard_acquire(&ToLower(char)::cType), iVar3 != 0)) {
        plVar5 = (locale *)std::locale::classic();
        ToLower(char)::cType = std::use_facet<std::ctype<char>>(plVar5);
        __cxa_guard_release(&ToLower(char)::cType);
      }
      cVar2 = (**(code **)(*(long *)ToLower(char)::cType + 0x20))(ToLower(char)::cType,(int)cVar1);
      cVar1 = *pcVar6;
      pcVar6 = pcVar6 + 1;
    } while (cVar2 == cVar1);
  }
  return bVar7;
}

Assistant:

static bool ConsumeSubString(Iterator* current,
                             Iterator end,
                             const char* substring,
                             bool allow_case_insensitivity) {
  if (allow_case_insensitivity) {
    return ConsumeSubStringImpl(current, end, substring, ToLower);
  } else {
    return ConsumeSubStringImpl(current, end, substring, Pass);
  }
}